

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsqlquerymodel.cpp
# Opt level: O1

void __thiscall QSqlQueryModel::clear(QSqlQueryModel *this)

{
  int *piVar1;
  long lVar2;
  QExplicitlySharedDataPointer<QSqlErrorPrivate> QVar3;
  QSqlQueryModelPrivate *d;
  long in_FS_OFFSET;
  QString local_88;
  QString local_68;
  QString local_48;
  QSqlError local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  lVar2 = *(long *)&this->field_0x8;
  if (*(int *)(lVar2 + 0x220) == 0) {
    QAbstractItemModel::beginResetModel();
  }
  *(int *)(lVar2 + 0x220) = *(int *)(lVar2 + 0x220) + 1;
  local_48.d.size = 0;
  local_48.d.d = (Data *)0x0;
  local_48.d.ptr = (char16_t *)0x0;
  local_68.d.size = 0;
  local_68.d.d = (Data *)0x0;
  local_68.d.ptr = (char16_t *)0x0;
  local_88.d.size = 0;
  local_88.d.d = (Data *)0x0;
  local_88.d.ptr = (char16_t *)0x0;
  QSqlError::QSqlError(&local_30,&local_48,&local_68,NoError,&local_88);
  QVar3.d.ptr = (totally_ordered_wrapper<QSqlErrorPrivate_*>)
                ((totally_ordered_wrapper<QSqlErrorPrivate_*> *)(lVar2 + 0xe0))->ptr;
  ((QExplicitlySharedDataPointer<QSqlErrorPrivate> *)(lVar2 + 0xe0))->d =
       (totally_ordered_wrapper<QSqlErrorPrivate_*>)local_30.d.d.ptr;
  local_30.d.d.ptr =
       (QExplicitlySharedDataPointer<QSqlErrorPrivate>)
       (QExplicitlySharedDataPointer<QSqlErrorPrivate>)QVar3.d.ptr;
  QSqlError::~QSqlError(&local_30);
  if (&(local_88.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_88.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
    }
  }
  *(byte *)(lVar2 + 0x108) = *(byte *)(lVar2 + 0x108) | 1;
  QSqlQuery::clear((QSqlQuery *)(lVar2 + 0xd8));
  QSqlRecord::clear((QSqlRecord *)(lVar2 + 0x100));
  *(undefined8 *)(lVar2 + 0x130) = 0;
  *(undefined8 *)(lVar2 + 0xe8) = 0xffffffffffffffff;
  *(undefined8 *)(lVar2 + 0xf0) = 0;
  *(undefined8 *)(lVar2 + 0xf8) = 0;
  QList<QHash<int,_QVariant>_>::clear((QList<QHash<int,_QVariant>_> *)(lVar2 + 0x110));
  piVar1 = (int *)(*(long *)&this->field_0x8 + 0x220);
  *piVar1 = *piVar1 + -1;
  if (*piVar1 == 0) {
    QAbstractItemModel::endResetModel();
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QSqlQueryModel::clear()
{
    Q_D(QSqlQueryModel);
    beginResetModel();
    d->error = QSqlError();
    d->atEnd = true;
    d->query.clear();
    d->rec.clear();
    d->colOffsets.clear();
    d->bottom = QModelIndex();
    d->headers.clear();
    endResetModel();
}